

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day19.cpp
# Opt level: O3

void day19(input_t input)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  uint32_t mult;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  uint32_t fk;
  int iVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  Quad tmp;
  array<unsigned_int,_2UL> part;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> V;
  uint32_t R [8];
  array<signed_char,_4UL> local_94;
  ulong local_90;
  void *local_88;
  iterator iStack_80;
  array<signed_char,_4UL> *local_78;
  ulong local_68 [5];
  uint local_3c [3];
  
  lVar7 = input.len;
  pcVar16 = input.s;
  do {
    bVar19 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar19) {
LAB_00110632:
      abort();
    }
    cVar1 = *pcVar16;
    pcVar16 = pcVar16 + 1;
  } while (5 < (byte)(cVar1 - 0x30U));
  local_78 = (array<signed_char,_4UL> *)0x0;
  bVar19 = false;
  local_88 = (void *)0x0;
  iStack_80._M_current = (array<signed_char,_4UL> *)0x0;
  if (lVar7 != 0) {
    lVar14 = 0;
    cVar11 = '\0';
    iVar6 = 0;
    do {
      if ((byte)(pcVar16[lVar14] - 0x30U) < 100) {
        cVar11 = (pcVar16[lVar14] - 0x30U) + cVar11 * '\n';
        bVar4 = true;
      }
      else {
        bVar4 = false;
        if (bVar19) {
          local_94._M_elems[iVar6] = cVar11;
          iVar6 = iVar6 + 1;
          cVar11 = '\0';
          bVar4 = false;
          if (iVar6 == 4) {
            if (iStack_80._M_current == local_78) {
              iVar6 = 0;
              std::vector<std::array<signed_char,4ul>,std::allocator<std::array<signed_char,4ul>>>::
              _M_realloc_insert<std::array<signed_char,4ul>const&>
                        ((vector<std::array<signed_char,4ul>,std::allocator<std::array<signed_char,4ul>>>
                          *)&local_88,iStack_80,&local_94);
              cVar11 = '\0';
              bVar4 = false;
            }
            else {
              iVar6 = 0;
              *&(iStack_80._M_current)->_M_elems = local_94._M_elems;
              iStack_80._M_current = iStack_80._M_current + 1;
              cVar11 = '\0';
              bVar4 = false;
            }
          }
        }
      }
      bVar19 = bVar4;
      lVar14 = lVar14 + 1;
    } while (lVar7 != lVar14);
  }
  uVar12 = (ulong)(byte)(cVar1 - 0x30U);
  lVar7 = 0;
  local_90 = 0x100000000;
  do {
    uVar9 = *(uint *)((long)&local_90 + lVar7);
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[0] = (ulong)uVar9;
    uVar15 = *(uint *)((long)local_68 + uVar12 * 4);
    while (uVar5 = (ulong)uVar15, uVar5 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2))
    {
      uVar8 = (uint)*(char *)((long)local_88 + uVar5 * 4 + 1);
      uVar17 = (uint)*(char *)((long)local_88 + uVar5 * 4 + 2);
      bVar2 = *(byte *)((long)local_88 + uVar5 * 4);
      uVar15 = *(uint *)((long)local_68 + (ulong)(uVar8 & 7) * 4);
      uVar3 = *(uint *)((long)local_68 + (ulong)(uVar17 & 7) * 4);
      if (bVar2 < 0xcd) {
        if (bVar2 < 0x4d) {
          if (bVar2 != 2) {
            uVar9 = uVar3;
            if (bVar2 != 0x42) goto LAB_00110632;
            break;
          }
          uVar8 = uVar3 + uVar15;
        }
        else if ((bVar2 != 0x4d) && (uVar8 = uVar15, bVar2 != 0x56)) goto LAB_00110632;
      }
      else if (bVar2 == 0xcd) {
        uVar8 = uVar15 * uVar17;
      }
      else if (bVar2 == 0xd6) {
        uVar8 = uVar3 * uVar15;
      }
      else {
        if (bVar2 != 0xf9) goto LAB_00110632;
        uVar8 = uVar15 + uVar17;
      }
      *(uint *)((long)local_68 + (ulong)(*(byte *)((long)local_88 + uVar5 * 4 + 3) & 7) * 4) = uVar8
      ;
      uVar15 = *(int *)((long)local_68 + uVar12 * 4) + 1;
      *(uint *)((long)local_68 + uVar12 * 4) = uVar15;
    }
    uVar5 = (ulong)uVar9;
    iVar6 = 1;
    local_3c[0] = 2;
    local_3c[1] = 3;
    lVar14 = 0;
    local_3c[2] = 5;
    do {
      uVar15 = *(uint *)((long)local_3c + lVar14);
      if ((int)(uVar5 % (ulong)uVar15) == 0) {
        iVar18 = 1;
        iVar13 = 1;
        do {
          uVar5 = uVar5 / uVar15;
          iVar13 = iVar13 * uVar15;
          iVar18 = iVar18 + iVar13;
        } while ((int)(uVar5 % (ulong)uVar15) == 0);
        iVar6 = iVar6 * iVar18;
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0xc);
    if (0x30 < (uint)uVar5) {
      uVar10 = 7;
      uVar15 = 0x62642424;
      do {
        if ((int)(uVar5 % uVar10) == 0) {
          iVar18 = 1;
          iVar13 = 1;
          do {
            uVar5 = uVar5 / uVar10;
            iVar13 = iVar13 * (int)uVar10;
            iVar18 = iVar18 + iVar13;
          } while ((int)(uVar5 % uVar10) == 0);
          iVar6 = iVar6 * iVar18;
        }
        uVar9 = (int)uVar10 + (uVar15 & 0xf);
        uVar10 = (ulong)uVar9;
        uVar15 = uVar15 >> 4 | uVar15 << 0x1c;
      } while (uVar9 * uVar9 <= (uint)uVar5);
    }
    iVar13 = (uint)uVar5 + 1;
    if ((uint)uVar5 < 2) {
      iVar13 = 1;
    }
    *(int *)((long)&local_90 + lVar7) = iVar13 * iVar6;
    lVar7 = lVar7 + 4;
    if (lVar7 == 8) {
      printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n",local_90 & 0xffffffff,local_90 >> 0x20);
      if (local_88 != (void *)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      return;
    }
  } while( true );
}

Assistant:

void day19(input_t input) {
	int8_t ipreg = -1;

	while (input.len--) {
		uint8_t c = *input.s++ - '0';
		if (c < 6) {
			ipreg = c;
			break;
		}
	}
	if (ipreg == -1) {
		abort();
	}

	std::vector<Quad> V;
	Quad tmp;
	for (int have = 0, n = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 100) {
			have = 1;
			n = 10 * n + c;
		} else if (have) {
			tmp[i] = n;
			n = have = 0;
			if (++i == 4) {
				i = 0;
				V.push_back(tmp);
			}
		}
	}

	std::array<uint32_t, 2> part = { 0, 1 };
	for (auto&& P : part) {
		uint32_t R[8] = { P };
		for (auto &ip = R[ipreg]; ip < V.size(); ip++) {
			auto &O = V[ip];
			auto Ia = O[1],    Ib = O[2],     Ic = O[3];
			auto Ra = R[Ia&7], Rb = R[Ib&7], &Rc = R[Ic&7];
			switch (O[0]) {
			    case  -7: Rc = Ra + Ib;    break;     // addi
			    case   2: Rc = Ra + Rb;    break;     // addr
			    case  66: P  = Rb;         goto done; // eqrr
			    case -51: Rc = Ra * Ib;    break;     // muli
			    case -42: Rc = Ra * Rb;    break;     // mulr
			    case  77: Rc = Ia;         break;     // seti
			    case  86: Rc = Ra;         break;     // setr
			    default: abort();
			}
		}
done:
		P = divisor_sum(P);
	}

	printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n", part[0], part[1]);
}